

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O2

void __thiscall mahjong::MinipointCounter::computeMelds(MinipointCounter *this)

{
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer pMVar6;
  Meld it;
  
  pMVar6 = (this->hand->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (this->hand->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pMVar6 == pMVar1) {
      return;
    }
    Meld::Meld(&it,pMVar6);
    bVar2 = Meld::isTripletOrQuad(&it);
    if (bVar2) {
      bVar2 = Meld::isHonors(&it);
      if (bVar2) {
LAB_0019391b:
        iVar5 = 4;
      }
      else {
        bVar2 = Meld::isTerminals(&it);
        iVar5 = 2;
        if (bVar2) goto LAB_0019391b;
      }
      bVar2 = Meld::isOpen(&it);
      bVar3 = Meld::isQuad(&it);
      iVar4 = (iVar5 << !bVar2) * 4;
      if (!bVar3) {
        iVar4 = iVar5 << !bVar2;
      }
      this->point = this->point + iVar4;
    }
    std::_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~_Vector_base
              ((_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_> *)&it);
    pMVar6 = pMVar6 + 1;
  } while( true );
}

Assistant:

void MinipointCounter::computeMelds()
{
	for (auto it : hand.melds)
	{
		if (it.isTripletOrQuad())
		{
			auto basic = 2;

			if (it.isHonors() || it.isTerminals())
			{
				basic *= 2;
			}

			if (!it.isOpen())
			{
				basic *= 2;
			}

			if (it.isQuad())
			{
				basic *= 4;
			}

			point += basic;
		}
	}
}